

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_CircularBuffer.h
# Opt level: O2

void __thiscall
axl::sl::CircularBufferBase<char>::copyTo
          (CircularBufferBase<char> *this,size_t i,char *p,size_t length)

{
  ulong uVar1;
  char *__dest;
  size_t __n;
  
  __dest = Array<char,_axl::sl::ArrayDetails<char>_>::p(&this->m_buffer);
  uVar1 = (this->m_buffer).super_ArrayRef<char,_axl::sl::ArrayDetails<char>_>.m_count;
  if (uVar1 < length + i) {
    __n = uVar1 - i;
    memmove(__dest + i,p,__n);
    p = p + __n;
    length = length - __n;
  }
  else {
    __dest = __dest + i;
  }
  memmove(__dest,p,length);
  return;
}

Assistant:

void
	copyTo(
		size_t i,
		const C* p,
		size_t length
	) {
		C* buffer = m_buffer.p();
		if (i + length <= m_buffer.getCount())
			sl::ArrayDetails<C>::copy(buffer + i, p, length);
		else {
			size_t tail = m_buffer.getCount() - i;
			ASSERT(tail);

			sl::ArrayDetails<C>::copy(buffer + i, p, tail);
			sl::ArrayDetails<C>::copy(buffer, p + tail, length - tail);
		}
	}